

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

void Dau_DsdWriteVar(Dau_Dsd_t *p,int iVar,int fInv)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
  if (fInv != 0) {
    iVar2 = p->nPos;
    p->nPos = iVar2 + 1;
    p->pOutput[iVar2] = '!';
  }
  cVar1 = p->pVarDefs[iVar][0];
  if (cVar1 != '\0') {
    pcVar3 = p->pVarDefs[iVar];
    do {
      pcVar3 = pcVar3 + 1;
      iVar2 = (int)cVar1;
      if ((iVar2 < p->nVarsInit + 0x61) || (p->nVarsUsed + 0x61 <= iVar2)) {
        iVar2 = p->nPos;
        p->nPos = iVar2 + 1;
        p->pOutput[iVar2] = cVar1;
      }
      else {
        Dau_DsdWriteVar(p,iVar2 + -0x61,0);
      }
      cVar1 = *pcVar3;
    } while (cVar1 != '\0');
  }
  return;
}

Assistant:

static inline void Dau_DsdWriteVar( Dau_Dsd_t * p, int iVar, int fInv )
{
    char * pStr;
    if ( fInv )
        p->pOutput[ p->nPos++ ] = '!';
    for ( pStr = p->pVarDefs[iVar]; *pStr; pStr++ )
        if ( *pStr >= 'a' + p->nVarsInit && *pStr < 'a' + p->nVarsUsed )
            Dau_DsdWriteVar( p, *pStr - 'a', 0 );
        else
            p->pOutput[ p->nPos++ ] = *pStr;
}